

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

optional<QFont::Tag> __thiscall QFont::Tag::fromString(Tag *this,QAnyStringView view)

{
  optional<QFont::Tag> oVar1;
  
  if (((ulong)view.field_0.m_data & 0x3fffffffffffffff) != 4) {
    fromString();
    return (_Optional_base<QFont::Tag,_true,_true>)
           (_Optional_payload<QFont::Tag,_true,_true,_true>)0x0;
  }
  oVar1.super__Optional_base<QFont::Tag,_true,_true>._M_payload.
  super__Optional_payload_base<QFont::Tag>._M_payload =
       (int)*(char *)((long)&this->m_value + 2) << 8 | (int)*(char *)((long)&this->m_value + 3) |
       (int)*(char *)((long)&this->m_value + 1) << 0x10 | (uint)(byte)this->m_value << 0x18;
  oVar1.super__Optional_base<QFont::Tag,_true,_true>._M_payload.
  super__Optional_payload_base<QFont::Tag>._M_engaged =
       oVar1.super__Optional_base<QFont::Tag,_true,_true>._M_payload.
       super__Optional_payload_base<QFont::Tag>._M_payload != 0;
  oVar1.super__Optional_base<QFont::Tag,_true,_true>._M_payload.
  super__Optional_payload_base<QFont::Tag>._5_3_ = 0;
  return (optional<QFont::Tag>)
         oVar1.super__Optional_base<QFont::Tag,_true,_true>._M_payload.
         super__Optional_payload_base<QFont::Tag>;
}

Assistant:

std::optional<QFont::Tag> QFont::Tag::fromString(QAnyStringView view) noexcept
{
    if (view.size() != 4) {
        qWarning("The tag name must be exactly 4 characters long!");
        return std::nullopt;
    }
    const QFont::Tag maybeTag = view.visit([](auto view) {
        using CharType = decltype(view.at(0));
        if constexpr (std::is_same_v<CharType, char>) {
            const char bytes[5] = { view.at(0), view.at(1), view.at(2), view.at(3), 0 };
            return Tag(bytes);
        } else {
            const char bytes[5] = { view.at(0).toLatin1(), view.at(1).toLatin1(),
                                    view.at(2).toLatin1(), view.at(3).toLatin1(), 0 };
            return Tag(bytes);
        }
    });
    return maybeTag.isValid() ? std::optional<Tag>(maybeTag) : std::nullopt;
}